

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::bindArgument
          (AssocArrayDeleteMethod *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax
          ,Args *args)

{
  Type *argType;
  Expression *pEVar1;
  
  if ((argIndex == 1) &&
     (argType = Type::getAssociativeIndexType(((*args->_M_ptr)->type).ptr), argType != (Type *)0x0))
  {
    pEVar1 = Expression::bindArgument
                       (argType,In,(bitmask<slang::ast::VariableFlags>)0x0,syntax,context);
    return pEVar1;
  }
  pEVar1 = SystemSubroutine::bindArgument
                     (&this->super_SystemSubroutine,argIndex,context,syntax,args);
  return pEVar1;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        // Argument type comes from the index type of the previous argument.
        if (argIndex == 1) {
            auto indexType = args[0]->type->getAssociativeIndexType();
            if (indexType) {
                return Expression::bindArgument(*indexType, ArgumentDirection::In, {}, syntax,
                                                context);
            }
        }

        return SystemSubroutine::bindArgument(argIndex, context, syntax, args);
    }